

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

iterator __thiscall cmComputeLinkDepends::AllocateLinkEntry(cmComputeLinkDepends *this,string *item)

{
  pointer pLVar1;
  pointer pLVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar3;
  LinkEntry local_78;
  value_type index_entry;
  
  pLVar1 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pLVar2 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&index_entry,(string *)item);
  index_entry.second = (int)(((long)pLVar1 - (long)pLVar2) / 0x30);
  pVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string_const,int>&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&this->LinkEntryIndex,&index_entry);
  local_78.Item._M_dataplus._M_p = (pointer)&local_78.Item.field_2;
  local_78.Item._M_string_length = 0;
  local_78.Item.field_2._M_allocated_capacity =
       local_78.Item.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_78.Target = (cmTarget *)0x0;
  local_78.IsSharedDep = false;
  local_78.IsFlag = false;
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  emplace_back<cmComputeLinkDepends::LinkEntry>(&this->EntryList,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  local_78.Item._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<cmComputeLinkDepends::DependSetList*,std::allocator<cmComputeLinkDepends::DependSetList*>>
  ::emplace_back<cmComputeLinkDepends::DependSetList*>
            ((vector<cmComputeLinkDepends::DependSetList*,std::allocator<cmComputeLinkDepends::DependSetList*>>
              *)&this->InferredDependSets,(DependSetList **)&local_78);
  local_78.Item._M_dataplus._M_p = (pointer)0x0;
  local_78.Item._M_string_length = 0;
  local_78.Item.field_2._M_allocated_capacity = 0;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::emplace_back<cmGraphEdgeList>
            (&(this->EntryConstraintGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             (cmGraphEdgeList *)&local_78);
  std::_Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>::~_Vector_base
            ((_Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)&local_78);
  std::__cxx11::string::~string((string *)&index_entry);
  return (iterator)pVar3.first._M_node._M_node;
}

Assistant:

std::map<std::string, int>::iterator
cmComputeLinkDepends::AllocateLinkEntry(std::string const& item)
{
  std::map<std::string, int>::value_type
    index_entry(item, static_cast<int>(this->EntryList.size()));
  std::map<std::string, int>::iterator
    lei = this->LinkEntryIndex.insert(index_entry).first;
  this->EntryList.push_back(LinkEntry());
  this->InferredDependSets.push_back(0);
  this->EntryConstraintGraph.push_back(EdgeList());
  return lei;
}